

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O2

void __thiscall
glcts::anon_unknown_0::UniformLocTypesStructs::~UniformLocTypesStructs(UniformLocTypesStructs *this)

{
  deqp::SubcaseBase::~SubcaseBase((SubcaseBase *)this);
  operator_delete(this,0x38);
  return;
}

Assistant:

virtual long Run()
	{

		/**
		 * This test case uses following uniform declarations:
		 *
		 * struct S {
		 *   vec4  u0;
		 *   float u1[2];
		 *   mat2  u2;
		 * };
		 * layout (location = 1) uniform S s0[3];
		 * layout (location = 13) uniform S s1;
		 */

		std::vector<UniformType> members;
		members.push_back(GL_FLOAT_VEC4);
		members.push_back(UniformType(GL_FLOAT, 2));
		members.push_back(GL_FLOAT_MAT2);
		std::vector<Uniform> uniforms;
		uniforms.push_back(Uniform(uniformValueGenerator, UniformType(uniformStructCounter, members, 3), Loc::C(1)));
		uniforms.push_back(Uniform(uniformValueGenerator, UniformType(uniformStructCounter, members), Loc::C(13)));
		return doRun(uniforms);
	}